

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

GCstr * string_fmt_tostring(lua_State *L,int arg,int retry)

{
  cTValue *pcVar1;
  long lVar2;
  lua_State *L_00;
  cTValue *pcVar3;
  undefined8 *puVar4;
  GCstr *pGVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  cTValue *mo;
  TValue *o;
  undefined8 in_stack_ffffffffffffff68;
  cTValue *in_stack_ffffffffffffff70;
  lua_State *in_stack_ffffffffffffff78;
  cTValue *in_stack_ffffffffffffffa0;
  lua_State *in_stack_ffffffffffffffa8;
  
  lVar2 = *(long *)(in_RDI + 0x10) + (long)in_ESI * 8;
  L_00 = (lua_State *)(lVar2 + -8);
  if (*(int *)(lVar2 + -4) == -5) {
    pGVar5 = (GCstr *)(ulong)(L_00->nextgc).gcptr32;
  }
  else {
    if ((in_EDX != 2) &&
       (pcVar3 = lj_meta_lookup(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                (MMS)((ulong)in_stack_ffffffffffffff68 >> 0x20)),
       (pcVar3->field_2).it != 0xffffffff)) {
      pcVar1 = *(cTValue **)(in_RDI + 0x18);
      *(cTValue **)(in_RDI + 0x18) = pcVar1 + 1;
      *pcVar1 = *pcVar3;
      puVar4 = *(undefined8 **)(in_RDI + 0x18);
      *(undefined8 **)(in_RDI + 0x18) = puVar4 + 1;
      *puVar4 = *(undefined8 *)L_00;
      lua_call(L_00,(int)((ulong)pcVar3 >> 0x20),(int)pcVar3);
      puVar4 = (undefined8 *)(*(long *)(in_RDI + 0x18) + -8);
      *(undefined8 **)(in_RDI + 0x18) = puVar4;
      *(undefined8 *)(*(long *)(in_RDI + 0x10) + (long)in_ESI * 8 + -8) = *puVar4;
      return (GCstr *)0x0;
    }
    pGVar5 = lj_strfmt_obj(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  }
  return pGVar5;
}

Assistant:

static GCstr *string_fmt_tostring(lua_State *L, int arg, int retry)
{
  TValue *o = L->base+arg-1;
  cTValue *mo;
  lj_assertL(o < L->top, "bad usage");  /* Caller already checks for existence. */
  if (LJ_LIKELY(tvisstr(o)))
    return strV(o);
  if (retry != 2 && !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
    copyTV(L, L->top++, mo);
    copyTV(L, L->top++, o);
    lua_call(L, 1, 1);
    copyTV(L, L->base+arg-1, --L->top);
    return NULL;  /* Buffer may be overwritten, retry. */
  }
  return lj_strfmt_obj(L, o);
}